

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::GLMClassifier::_InternalParse
          (GLMClassifier *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  Rep *pRVar2;
  bool bVar3;
  GLMClassifier_DoubleArray *obj;
  MessageLite *msg;
  StringVector *msg_00;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *p;
  Arena *pAVar7;
  char cVar8;
  uint uVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  double *local_48;
  InternalMetadata *local_40;
  RepeatedField<double> *local_38;
  
  local_48 = (double *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar3) {
    local_40 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->offset_;
    do {
      bVar1 = *(byte *)local_48;
      uVar9 = (uint)bVar1;
      p = (double *)((long)local_48 + 1);
      if ((char)bVar1 < '\0') {
        uVar9 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_48,uVar9);
          p = (double *)pVar10.first;
          uVar9 = pVar10.second;
        }
        else {
          p = (double *)((long)local_48 + 2);
        }
      }
      uVar4 = uVar9 >> 3;
      cVar8 = (char)uVar9;
      local_48 = p;
      switch(uVar4) {
      case 1:
        if (cVar8 != '\n') break;
        local_48 = (double *)((long)p + -1);
        do {
          local_48 = (double *)((long)local_48 + 1);
          pRVar2 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar2 == (Rep *)0x0) {
LAB_001fe28b:
            obj = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::GLMClassifier_DoubleArray>
                            ((this->weights_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->weights_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar5 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar2->allocated_size <= iVar5) goto LAB_001fe28b;
            (this->weights_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            msg = (MessageLite *)pRVar2->elements[iVar5];
          }
          local_48 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,msg,(char *)local_48);
          if (local_48 == (double *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_48 == '\n'));
        goto LAB_001fe4b4;
      case 2:
        if (cVar8 != '\x12') {
          if ((uVar9 & 0xff) != 0x11) break;
          _internal_add_offset(this,*p);
          local_48 = local_48 + 1;
          goto LAB_001fe4b4;
        }
        local_48 = (double *)google::protobuf::internal::PackedDoubleParser(local_38,(char *)p,ctx);
        goto LAB_001fe4ab;
      case 3:
        if (cVar8 == '\x18') {
          uVar6 = (ulong)(char)*(byte *)p;
          local_48 = (double *)((long)p + 1);
          if ((long)uVar6 < 0) {
            uVar9 = ((uint)*(byte *)local_48 * 0x80 + (uint)*(byte *)p) - 0x80;
            if (-1 < (char)*(byte *)local_48) {
              uVar6 = (ulong)uVar9;
              local_48 = (double *)((long)p + 2);
              goto LAB_001fe373;
            }
            local_48 = p;
            pVar11 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar9);
            iVar5 = (int)pVar11.second;
            local_48 = (double *)pVar11.first;
            if (local_48 == (double *)0x0) {
              return (char *)0x0;
            }
          }
          else {
LAB_001fe373:
            iVar5 = (int)uVar6;
          }
          this->postevaluationtransform_ = iVar5;
          goto LAB_001fe4b4;
        }
        break;
      case 4:
        if (cVar8 == ' ') {
          uVar6 = (ulong)(char)*(byte *)p;
          local_48 = (double *)((long)p + 1);
          if ((long)uVar6 < 0) {
            uVar9 = ((uint)*(byte *)local_48 * 0x80 + (uint)*(byte *)p) - 0x80;
            if (-1 < (char)*(byte *)local_48) {
              uVar6 = (ulong)uVar9;
              local_48 = (double *)((long)p + 2);
              goto LAB_001fe3b8;
            }
            local_48 = p;
            pVar11 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar9);
            iVar5 = (int)pVar11.second;
            local_48 = (double *)pVar11.first;
            if (local_48 == (double *)0x0) {
              return (char *)0x0;
            }
          }
          else {
LAB_001fe3b8:
            iVar5 = (int)uVar6;
          }
          this->classencoding_ = iVar5;
          goto LAB_001fe4b4;
        }
        break;
      default:
        if (uVar4 == 100) {
          if (cVar8 == '\"') {
            if (this->_oneof_case_[0] != 100) {
              clear_ClassLabels(this);
              this->_oneof_case_[0] = 100;
              uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar7 = (Arena *)(uVar6 & 0xfffffffffffffffc);
              if ((uVar6 & 1) != 0) {
                pAVar7 = *(Arena **)pAVar7;
              }
              msg_00 = google::protobuf::Arena::
                       CreateMaybeMessage<CoreML::Specification::StringVector>(pAVar7);
              goto LAB_001fe40c;
            }
LAB_001fe332:
            msg_00 = (this->ClassLabels_).stringclasslabels_;
            goto LAB_001fe417;
          }
        }
        else if ((uVar4 == 0x65) && (cVar8 == '*')) {
          if (this->_oneof_case_[0] == 0x65) goto LAB_001fe332;
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar7 = (Arena *)(uVar6 & 0xfffffffffffffffc);
          if ((uVar6 & 1) != 0) {
            pAVar7 = *(Arena **)pAVar7;
          }
          msg_00 = (StringVector *)
                   google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                             (pAVar7);
LAB_001fe40c:
          (this->ClassLabels_).int64classlabels_ = (Int64Vector *)msg_00;
LAB_001fe417:
          local_48 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg_00->super_MessageLite,(char *)local_48);
          goto LAB_001fe4ab;
        }
      }
      if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
        if (p == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
        return (char *)p;
      }
      if ((local_40->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_40);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_48 = (double *)
                 google::protobuf::internal::UnknownFieldParse(uVar9,unknown,(char *)local_48,ctx);
LAB_001fe4ab:
      if (local_48 == (double *)0x0) {
        return (char *)0x0;
      }
LAB_001fe4b4:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_48;
}

Assistant:

const char* GLMClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated double offset = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_offset(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 17) {
          _internal_add_offset(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_postevaluationtransform(static_cast<::CoreML::Specification::GLMClassifier_PostEvaluationTransform>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 32)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_classencoding(static_cast<::CoreML::Specification::GLMClassifier_ClassEncoding>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}